

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer_type.cpp
# Opt level: O3

string * __thiscall
duckdb::OptimizerTypeToString_abi_cxx11_
          (string *__return_storage_ptr__,duckdb *this,OptimizerType type)

{
  long lVar1;
  size_t sVar2;
  InternalException *this_00;
  long lVar3;
  char *__s;
  string local_40;
  
  if ((int)this == 1) {
    __s = "expression_rewriter";
  }
  else {
    lVar1 = 0x18;
    do {
      lVar3 = lVar1;
      if (lVar3 + 0x10 == 0x1c8) {
        this_00 = (InternalException *)__cxa_allocate_exception(0x10);
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,"Invalid optimizer type","");
        InternalException::InternalException(this_00,&local_40);
        __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      lVar1 = lVar3 + 0x10;
    } while (*(int *)(internal_optimizer_types + lVar3) != (int)this);
    __s = *(char **)((long)&PTR_typeinfo_01967408 + lVar3);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar2 = strlen(__s);
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,__s,__s + sVar2);
  return __return_storage_ptr__;
}

Assistant:

string OptimizerTypeToString(OptimizerType type) {
	for (idx_t i = 0; internal_optimizer_types[i].name; i++) {
		if (internal_optimizer_types[i].type == type) {
			return internal_optimizer_types[i].name;
		}
	}
	throw InternalException("Invalid optimizer type");
}